

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_helpers.c
# Opt level: O1

int SetHTTPrequest(OperationConfig *config,HttpReq req,HttpReq *store)

{
  HttpReq HVar1;
  undefined8 in_R9;
  
  HVar1 = *store;
  if (HVar1 == TOOL_HTTPREQ_UNSPEC || HVar1 == req) {
    *store = req;
    return 0;
  }
  warnf(config->global,"You can only select one HTTP request method! You asked for both %s and %s.",
        *(undefined8 *)(&DAT_001452f0 + (ulong)req * 8),
        *(undefined8 *)(&DAT_001452f0 + (ulong)HVar1 * 8),HVar1 != req,in_R9,(ulong)HVar1);
  return 1;
}

Assistant:

int SetHTTPrequest(struct OperationConfig *config, HttpReq req, HttpReq *store)
{
  /* this mirrors the HttpReq enum in tool_sdecls.h */
  const char *reqname[]= {
    "", /* unspec */
    "GET (-G, --get)",
    "HEAD (-I, --head)",
    "multipart formpost (-F, --form)",
    "POST (-d, --data)",
    "PUT (-T, --upload-file)"
  };

  if((*store == TOOL_HTTPREQ_UNSPEC) ||
     (*store == req)) {
    *store = req;
    return 0;
  }
  warnf(config->global, "You can only select one HTTP request method! "
        "You asked for both %s and %s.",
        reqname[req], reqname[*store]);

  return 1;
}